

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_cleave(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  CClass *this;
  OBJ_DATA *pOVar10;
  CHAR_DATA *victim;
  char *__format;
  char *pcVar11;
  long lVar12;
  char buf [4608];
  char arg [4608];
  
  iVar3 = get_skill(ch,(int)gsn_cleave);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar12 = (long)gsn_cleave;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar12 * 0x60 + 0x44e788 + (long)iVar4 * 2) <= sVar1) {
      one_argument(argument,arg);
      pOVar10 = get_eq_char(ch,0x10);
      if ((pOVar10 == (OBJ_DATA *)0x0) || ((pOVar10->value[0] | 4U) != 5)) {
        pcVar11 = "You need to wield a sword or axe to cleave.\n\r";
      }
      else {
        victim = get_char_room(ch,arg);
        if (victim == (CHAR_DATA *)0x0) {
          pcVar11 = "They aren\'t here.\n\r";
        }
        else if (victim == ch) {
          pcVar11 = "You can\'t do such a thing.\n\r";
        }
        else if (victim->fighting == (CHAR_DATA *)0x0) {
          if (victim->hit < 0x2711) {
            bVar2 = is_safe_new(ch,victim,true);
            if (bVar2) {
              return;
            }
            bVar2 = check_shroud_of_light(ch,victim);
            if (bVar2) {
              return;
            }
            bVar2 = check_sidestep(ch,victim,(int)gsn_cleave,0x5f);
            if (bVar2) {
              return;
            }
            iVar5 = (int)ch->level - (int)victim->level;
            iVar4 = iVar5 * -3;
            if (-1 < iVar5) {
              iVar4 = iVar5;
            }
            iVar6 = get_curr_stat(ch,0);
            iVar7 = get_curr_stat(victim,3);
            iVar7 = (int)((ulong)((long)iVar7 * 0x55555555) >> 0x20) - iVar7;
            iVar8 = get_curr_stat(victim,0);
            iVar5 = iVar8 + 3;
            if (-1 < iVar8) {
              iVar5 = iVar8;
            }
            iVar9 = get_curr_stat(victim,4);
            iVar8 = iVar9 + 3;
            if (-1 < iVar9) {
              iVar8 = iVar9;
            }
            iVar5 = ((((iVar7 >> 1) - (iVar7 >> 0x1f)) + iVar4 + iVar6 / 2 + iVar3 / 5) -
                    (iVar5 >> 2)) - (iVar8 >> 2);
            iVar3 = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>.
                    _M_impl.super__Vector_impl_data._M_start[pOVar10->value[3]].damage;
            bVar2 = can_see(victim,ch);
            iVar4 = iVar5 + 5;
            if (bVar2) {
              iVar4 = iVar5;
            }
            iVar5 = dice(2,6);
            iVar4 = iVar4 - iVar5;
            if (5 < iVar4) {
              iVar4 = 6;
            }
            if (iVar4 < 2) {
              iVar4 = 1;
            }
            iVar5 = number_percent();
            pcVar11 = pers(ch,victim);
            __format = "Help! %s just tried to cleave me in half!";
            if (iVar5 < 0x32) {
              __format = "Die, %s you butchering fool!";
            }
            sprintf(buf,__format,pcVar11);
            iVar5 = get_weapon_sn(ch);
            iVar7 = get_weapon_skill(ch,iVar5);
            iVar8 = get_skill(ch,(int)gsn_cleave);
            iVar5 = iVar8 + iVar7;
            iVar6 = 100;
            if (iVar5 < 0xc0) {
              iVar6 = (int)(short)((short)((iVar8 + iVar7 + 10U & 0xffff) >> 0xf) + (short)iVar5 +
                                  10) >> 1;
            }
            if (iVar5 < -0xb) {
              iVar6 = 0;
            }
            bVar2 = IS_IMP(ch);
            iVar5 = iVar4 + 100;
            if (!bVar2) {
              iVar5 = iVar4;
            }
            act("You make a brutal swing at $N in an attempt to cleave them in half.",ch,(void *)0x0
                ,victim,3);
            act("$n attempts to cleave you in half with a brutal slice.",ch,(void *)0x0,victim,2);
            act("$n makes an attempt to cleave $N in half.",ch,(void *)0x0,victim,1);
            bVar2 = is_npc(victim);
            if (bVar2) {
              victim->last_fought = ch;
            }
            iVar4 = number_percent();
            if (iVar5 < iVar4) {
              check_improve(ch,(int)gsn_cleave,false,5);
              if (pOVar10->pIndexData->new_format == true) {
                iVar4 = dice(pOVar10->value[1],pOVar10->value[2]);
                iVar4 = (iVar4 * iVar6) / 100;
              }
              else {
                iVar4 = number_range((pOVar10->value[1] * iVar6) / 100,
                                     (iVar6 * pOVar10->value[2]) / 100);
              }
              iVar5 = number_range((int)ch->level / 10,(int)ch->level / 7);
              damage_new(ch,victim,iVar4 * iVar5,(int)gsn_cleave,iVar3,true,true,0,1,(char *)0x0);
              bVar2 = is_npc(victim);
              if (((!bVar2) && (bVar2 = is_npc(ch), !bVar2)) && (1 < victim->hit)) {
                do_myell(victim,buf,ch);
              }
              WAIT_STATE(ch,0x24);
              LAG_CHAR(victim,0x18);
              return;
            }
            act("Your cleave slices $S body in half with a clean cut!",ch,(void *)0x0,victim,3);
            act("$n cleaves you in half, tearing your body into two bloody bits!",ch,(void *)0x0,
                victim,2);
            act("$n cleaves $N into bits of bloody flesh!",ch,(void *)0x0,victim,1);
            check_improve(ch,(int)gsn_cleave,true,5);
            raw_kill(ch,victim);
            return;
          }
          pcVar11 = "They are much too massive to cut through in a single cleave.\n\r";
        }
        else {
          pcVar11 = "They are moving too much to cleave.\n\r";
        }
      }
      send_to_char(pcVar11,ch);
      return;
    }
  }
  send_to_char("You don\'t know how to cleave.\n\r",ch);
  return;
}

Assistant:

void do_cleave(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *weapon;
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int dam, chance, dam_type;
	char buf[MAX_STRING_LENGTH];
	int sn;
	int skill;

	chance = get_skill(ch, gsn_cleave);

	if (chance == 0 ||
		ch->level < skill_table[gsn_cleave].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to cleave.\n\r", ch);
		return;
	}

	one_argument(argument, arg);
	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		send_to_char("You need to wield a sword or axe to cleave.\n\r", ch);
		return;
	}

	if (weapon->value[0] != WEAPON_SWORD && weapon->value[0] != WEAPON_AXE)
	{
		send_to_char("You need to wield a sword or axe to cleave.\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do such a thing.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr)
	{
		send_to_char("They are moving too much to cleave.\n\r", ch);
		return;
	}

	if (victim->hit > 10000)
	{
		send_to_char("They are much too massive to cut through in a single cleave.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_cleave, 95))
		return;

	chance /= 5;

	if ((ch->level - victim->level) < 0)
		chance -= (ch->level - victim->level) * 3;
	else
		chance += (ch->level - victim->level);

	chance += get_curr_stat(ch, STAT_STR) / 2;
	chance -= get_curr_stat(victim, STAT_DEX) / 3; /* Improve evasion */
	chance -= get_curr_stat(victim, STAT_STR) / 4; /* Improve repelling */
	chance -= get_curr_stat(victim, STAT_CON) / 4; /* Shock survival */
	dam_type = attack_table[weapon->value[3]].damage;

	if (!can_see(victim, ch))
		chance += 5;

	chance -= dice(2, 6);
	chance = URANGE(1, chance, 6);

	if (number_percent() < 50)
		sprintf(buf, "Die, %s you butchering fool!", pers(ch, victim));
	else
		sprintf(buf, "Help! %s just tried to cleave me in half!", pers(ch, victim));

	sn = get_weapon_sn(ch);
	skill = get_weapon_skill(ch, sn) + get_skill(ch, gsn_cleave) + 10;
	skill = URANGE(0, skill / 2, 100);

	if (IS_IMP(ch))
		chance += 100;

	act("You make a brutal swing at $N in an attempt to cleave them in half.", ch, 0, victim, TO_CHAR);
	act("$n attempts to cleave you in half with a brutal slice.", ch, 0, victim, TO_VICT);
	act("$n makes an attempt to cleave $N in half.", ch, 0, victim, TO_NOTVICT);

	if (is_npc(victim))
		victim->last_fought = ch;

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_cleave, false, 5);

		if (weapon->pIndexData->new_format)
			dam = dice(weapon->value[1], weapon->value[2]) * skill / 100;
		else
			dam = number_range(weapon->value[1] * skill / 100, weapon->value[2] * skill / 100);

		dam *= number_range(ch->level / 10, ch->level / 7);

		damage_old(ch, victim, dam, gsn_cleave, dam_type, true);

		if (!is_npc(victim) && !is_npc(ch) && victim->hit > 1)
			do_myell(victim, buf, ch);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);
		LAG_CHAR(victim, PULSE_VIOLENCE * 2);
		return;
	}

	act("Your cleave slices $S body in half with a clean cut!", ch, 0, victim, TO_CHAR);
	act("$n cleaves you in half, tearing your body into two bloody bits!", ch, 0, victim, TO_VICT);
	act("$n cleaves $N into bits of bloody flesh!", ch, 0, victim, TO_NOTVICT);
	check_improve(ch, gsn_cleave, true, 5);
	raw_kill(ch, victim);
}